

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Track::Dump(Track *this,FILE *stream)

{
  char identbuf [128];
  char local_a8 [136];
  
  local_a8[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  GenericTrack::Dump(&this->super_GenericTrack,stream);
  snprintf(local_a8,0x80,"%d/%d",(ulong)(uint)(this->EditRate).super_Rational.Numerator,
           (ulong)(uint)(this->EditRate).super_Rational.Denominator);
  fprintf((FILE *)stream,"  %22s = %s\n","EditRate",local_a8);
  snprintf(local_a8,0x40,"%lld",this->Origin);
  fprintf((FILE *)stream,"  %22s = %s\n","Origin",local_a8);
  return;
}

Assistant:

void
Track::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericTrack::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "EditRate", EditRate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "Origin", i64sz(Origin, identbuf));
}